

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incgamma.cpp
# Opt level: O2

double numerary::Numerary::incgamma(double *a,double *x,double *eps)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar2 = *a;
  iVar1 = 1;
  dVar5 = 0.0;
  for (dVar3 = 1.0 / dVar2; *eps < dVar3; dVar3 = dVar3 * (*x / (dVar4 + dVar2))) {
    dVar5 = dVar5 + dVar3;
    dVar4 = (double)iVar1;
    iVar1 = iVar1 + 1;
  }
  dVar2 = pow(*x,dVar2);
  dVar3 = exp(-*x);
  return dVar3 * dVar2 * dVar5;
}

Assistant:

double Numerary::incgamma(const double& a, const double& x, const double& eps)
    {
        double term=1.0/a, sum = 0;
        int n=1;
        while (term > eps) {
            sum = sum + term;
            term = term*(x/(a+n));
            n++;
        }

        return pow(x,a)*exp(-1*x)*sum;
    }